

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::ConvolutionDepthWise::destroy_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  pointer pfVar4;
  int i;
  long lVar5;
  Option opt_cpu;
  undefined4 local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Allocator *local_38;
  ulong uStack_30;
  undefined8 local_28;
  
  local_48 = *(undefined4 *)opt;
  iStack_44 = opt->num_threads;
  uStack_40 = *(undefined4 *)&opt->blob_allocator;
  uStack_3c = *(undefined4 *)((long)&opt->blob_allocator + 4);
  local_38 = opt->workspace_allocator;
  uStack_30._0_1_ = opt->vulkan_compute;
  uStack_30._1_3_ = *(undefined3 *)&opt->field_0x19;
  uStack_30._4_4_ = opt->use_winograd_convolution;
  local_28._0_4_ = opt->use_sgemm_convolution;
  local_28._4_4_ = opt->use_int8_inference;
  uStack_30 = uStack_30 & 0xffffffffffffff00;
  lVar5 = 0;
  while( true ) {
    ppLVar1 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3) <= lVar5) break;
    (*ppLVar1[lVar5]->_vptr_Layer[5])(ppLVar1[lVar5],&local_48);
    pLVar3 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar5];
    if (pLVar3 != (Layer *)0x0) {
      (*pLVar3->_vptr_Layer[1])();
    }
    lVar5 = lVar5 + 1;
  }
  if (ppLVar2 != ppLVar1) {
    (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar1;
  }
  lVar5 = 0;
  while( true ) {
    ppLVar1 = (this->dequantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppLVar2 = (this->dequantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3) <= lVar5) break;
    (*ppLVar1[lVar5]->_vptr_Layer[5])(ppLVar1[lVar5],&local_48);
    pLVar3 = (this->dequantize_ops).
             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
    if (pLVar3 != (Layer *)0x0) {
      (*pLVar3->_vptr_Layer[1])();
    }
    lVar5 = lVar5 + 1;
  }
  if (ppLVar2 != ppLVar1) {
    (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar1;
  }
  lVar5 = 0;
  while( true ) {
    ppLVar1 = (this->requantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppLVar2 = (this->requantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3) <= lVar5) break;
    (*ppLVar1[lVar5]->_vptr_Layer[5])(ppLVar1[lVar5],&local_48);
    pLVar3 = (this->requantize_ops).
             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
    if (pLVar3 != (Layer *)0x0) {
      (*pLVar3->_vptr_Layer[1])();
    }
    lVar5 = lVar5 + 1;
  }
  if (ppLVar2 != ppLVar1) {
    (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar1;
  }
  pfVar4 = (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar4;
  }
  pfVar4 = (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar4;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::destroy_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    for (int i=0; i<(int)quantize_ops.size(); i++)
    {
        quantize_ops[i]->destroy_pipeline(opt_cpu);
        delete quantize_ops[i];
    }
    quantize_ops.clear();

    for (int i=0; i<(int)dequantize_ops.size(); i++)
    {
        dequantize_ops[i]->destroy_pipeline(opt_cpu);
        delete dequantize_ops[i];
    }
    dequantize_ops.clear();

    for (int i=0; i<(int)requantize_ops.size(); i++)
    {
        requantize_ops[i]->destroy_pipeline(opt_cpu);
        delete requantize_ops[i];
    }
    requantize_ops.clear();

    dequantize_scales.clear();
    requantize_scales.clear();

    return 0;
}